

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyGetToken(TidyDocImpl *doc,GetTokenMode mode)

{
  Lexer *pLVar1;
  Node *pNVar2;
  Lexer *lexer;
  Node *node;
  GetTokenMode mode_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((pLVar1->pushed == no) && (pLVar1->itoken == (Node *)0x0)) {
    if ((pLVar1->pushed != no) || (pLVar1->itoken != (Node *)0x0)) {
      __assert_fail("!(lexer->pushed || lexer->itoken)",
                    "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/lexer.c"
                    ,0x8d8,"Node *prvTidyGetToken(TidyDocImpl *, GetTokenMode)");
    }
    if ((pLVar1->insert == (IStack *)0x0) && (pLVar1->inode == (Node *)0x0)) {
      if (mode == CdataContent) {
        if (pLVar1->parent == (Node *)0x0) {
          __assert_fail("lexer->parent != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/lexer.c"
                        ,0x8e8,"Node *prvTidyGetToken(TidyDocImpl *, GetTokenMode)");
        }
        doc_local = (TidyDocImpl *)GetCDATA(doc,pLVar1->parent);
      }
      else {
        doc_local = (TidyDocImpl *)GetTokenFromStream(doc,mode);
      }
    }
    else {
      pNVar2 = prvTidyInsertedToken(doc);
      pLVar1->token = pNVar2;
      doc_local = (TidyDocImpl *)pLVar1->token;
    }
  }
  else {
    if (pLVar1->itoken != (Node *)0x0) {
      if (pLVar1->pushed != no) {
        pLVar1->pushed = no;
        return pLVar1->itoken;
      }
      pLVar1->itoken = (Node *)0x0;
    }
    pLVar1->pushed = no;
    if ((pLVar1->token->type == TextNode) &&
       ((pLVar1->insert != (IStack *)0x0 || (pLVar1->inode != (Node *)0x0)))) {
      pNVar2 = prvTidyInsertedToken(doc);
      pLVar1->itoken = pNVar2;
      doc_local = (TidyDocImpl *)pLVar1->itoken;
    }
    else {
      doc_local = (TidyDocImpl *)pLVar1->token;
    }
  }
  return &doc_local->root;
}

Assistant:

Node* TY_(GetToken)( TidyDocImpl* doc, GetTokenMode mode )
{
    Node *node;
    Lexer* lexer = doc->lexer;

    if (lexer->pushed || lexer->itoken)
    {
        /* Deal with previously returned duplicate inline token */
        if (lexer->itoken)
        {
            /* itoken rejected */
            if (lexer->pushed)
            {
                lexer->pushed = no;
                node = lexer->itoken;
                GTDBG(doc,"lex-itoken", node);
                return node;
            }
            /* itoken has been accepted */
            lexer->itoken = NULL;
        }
            
        /* duplicate inlines in preference to pushed text nodes when appropriate */
        lexer->pushed = no;
        if (lexer->token->type != TextNode
            || !(lexer->insert || lexer->inode)) {
            node = lexer->token;
            GTDBG(doc,"lex-token", node);
            return node;
        }
        lexer->itoken = TY_(InsertedToken)( doc );
        node = lexer->itoken;
        GTDBG(doc,"lex-inserted", node);
        return node;
    }

    assert( !(lexer->pushed || lexer->itoken) );

    /* at start of block elements, unclosed inline
       elements are inserted into the token stream */
    if (lexer->insert || lexer->inode) {
        /*\ Issue #92: could fix by the following, but instead chose not to stack these 2
         *  if ( !(lexer->insert && (nodeIsINS(lexer->insert) || nodeIsDEL(lexer->insert))) ) {
        \*/
        lexer->token = TY_(InsertedToken)( doc );
        node = lexer->token;
        GTDBG(doc,"lex-inserted2", node);
        return node;
    }

    if (mode == CdataContent)
    {
        assert( lexer->parent != NULL );
        node = GetCDATA(doc, lexer->parent);
        GTDBG(doc,"lex-cdata", node);
        return node;
    }

    return GetTokenFromStream( doc, mode );
}